

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void DumpString(TString *s,DumpState *D)

{
  size_t sVar1;
  ulong *b;
  TString *b_00;
  lu_byte x_2;
  lu_byte x;
  lu_byte x_1;
  size_t size;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  ulong local_18;
  
  if (s == (TString *)0x0) {
    b_00 = (TString *)&local_1b;
    local_1b = 0;
    sVar1 = 1;
  }
  else {
    if (s->tt == '\x04') {
      local_18 = (ulong)s->shrlen;
    }
    else {
      local_18 = (s->u).lnglen;
    }
    local_18 = local_18 + 1;
    b_00 = s + 1;
    if (local_18 < 0xff) {
      b = (ulong *)&local_1a;
      local_1a = (undefined1)local_18;
      sVar1 = 1;
    }
    else {
      local_19 = 0xff;
      DumpBlock(&local_19,1,D);
      b = &local_18;
      sVar1 = 8;
    }
    DumpBlock(b,sVar1,D);
    sVar1 = local_18 - 1;
  }
  DumpBlock(b_00,sVar1,D);
  return;
}

Assistant:

static void DumpString (const TString *s, DumpState *D) {
  if (s == NULL)
    DumpByte(0, D);
  else {
    size_t size = tsslen(s) + 1;  /* include trailing '\0' */
    const char *str = getstr(s);
    if (size < 0xFF)
      DumpByte(cast_int(size), D);
    else {
      DumpByte(0xFF, D);
      DumpVar(size, D);
    }
    DumpVector(str, size - 1, D);  /* no need to save '\0' */
  }
}